

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessCommDataset
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  bool bVar1;
  element_type *this_00;
  Value *this_01;
  Value local_100;
  ErrorCode local_b8 [4];
  Error local_a8;
  Value local_80;
  undefined1 local_38 [8];
  CommissionerAppPtr commissioner;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  Value::Value(__return_storage_ptr__);
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_38,(nullptr_t)0x0);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mJobManager);
  JobManager::GetSelectedCommissioner(&local_a8,this_00,(CommissionerAppPtr *)local_38);
  Value::Value(&local_80,&local_a8);
  this_01 = Value::operator=(__return_storage_ptr__,&local_80);
  local_b8[0] = kNone;
  bVar1 = Value::operator!=(this_01,local_b8);
  Value::~Value(&local_80);
  Error::~Error(&local_a8);
  if (!bVar1) {
    ProcessCommDatasetJob(&local_100,this,(CommissionerAppPtr *)local_38,aExpr);
    Value::operator=(__return_storage_ptr__,&local_100);
    Value::~Value(&local_100);
  }
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_38);
  if ((commissioner.
       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._7_1_ & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessCommDataset(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    value = ProcessCommDatasetJob(commissioner, aExpr);
exit:
    return value;
}